

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encapsulation.cpp
# Opt level: O1

void __thiscall
Encapsulation_encapsulatedComponentMethods_Test::TestBody
          (Encapsulation_encapsulatedComponentMethods_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  shared_ptr *psVar2;
  element_type *peVar3;
  string *psVar4;
  char cVar5;
  undefined1 uVar6;
  char *pcVar7;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar__3;
  ComponentPtr c6take;
  ComponentPtr c;
  ComponentPtr constC4;
  ComponentPtr c4n;
  ComponentPtr c5;
  ComponentPtr c4;
  ComponentPtr c6;
  ComponentPtr c3;
  ComponentPtr c2;
  ComponentPtr c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  shared_ptr<libcellml::Component> local_d0;
  long *local_c0;
  shared_ptr<libcellml::Component> local_b8;
  shared_ptr *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  AssertHelper local_98 [8];
  internal local_90 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  shared_ptr<libcellml::Component> local_80;
  string *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  shared_ptr<libcellml::Component> local_60;
  shared_ptr<libcellml::Component> local_50;
  string *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  string *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  string *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  libcellml::Component::create();
  libcellml::Component::create();
  libcellml::Component::create();
  libcellml::Component::create();
  libcellml::Component::create();
  libcellml::Component::create();
  libcellml::Component::create();
  libcellml::Component::create();
  psVar4 = local_20;
  paVar1 = &local_f0.field_2;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"comp1","");
  libcellml::NamedEntity::setName(psVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  psVar4 = local_30;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"comp2","");
  libcellml::NamedEntity::setName(psVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  psVar4 = local_40;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"comp3","");
  libcellml::NamedEntity::setName(psVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  peVar3 = local_60.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"comp4","");
  libcellml::NamedEntity::setName((string *)peVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  psVar4 = local_70;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"comp5","");
  libcellml::NamedEntity::setName(psVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"comp6","");
  libcellml::NamedEntity::setName
            ((string *)
             local_50.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  peVar3 = local_80.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"comp4new","");
  libcellml::NamedEntity::setName((string *)peVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  libcellml::ComponentEntity::addComponent(local_a8);
  libcellml::ComponentEntity::addComponent((shared_ptr *)local_20);
  libcellml::ComponentEntity::addComponent((shared_ptr *)local_30);
  libcellml::ComponentEntity::addComponent((shared_ptr *)local_40);
  libcellml::ComponentEntity::addComponent
            ((shared_ptr *)
             local_60.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::ComponentEntity::addComponent((shared_ptr *)local_70);
  psVar2 = local_a8;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"comp5","");
  local_90[0] = (internal)
                libcellml::ComponentEntity::containsComponent((string *)psVar2,SUB81(&local_f0,0));
  local_88.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_90[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_f0,(char *)local_90,"c->containsComponent(\"comp5\")",
               "false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/component/encapsulation.cpp"
               ,0x173,local_f0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if (local_b8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      cVar5 = testing::internal::IsTrue(true);
      if ((cVar5 != '\0') &&
         (local_b8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0)) {
        (**(code **)(*(long *)local_b8.
                              super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 8))();
      }
      local_b8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar2 = local_a8;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"comp4","");
  libcellml::ComponentEntity::component((string *)&local_b8,SUB81(psVar2,0));
  testing::internal::
  CmpHelperEQ<std::shared_ptr<libcellml::Component>,std::shared_ptr<libcellml::Component>>
            (local_90,"c4","c->component(\"comp4\")",&local_60,&local_b8);
  if (local_b8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_90[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f0);
    if (local_88.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_88.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/component/encapsulation.cpp"
               ,0x175,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      cVar5 = testing::internal::IsTrue(true);
      if ((cVar5 != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_f0._M_dataplus._M_p + 8))();
      }
      local_f0._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar2 = local_a8;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"comp4","");
  libcellml::ComponentEntity::component((string *)local_90,SUB81(psVar2,0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  libcellml::NamedEntity::name_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_b8,"\"comp4\"","constC4->name()",(char (*) [6])"comp4",&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_b8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ ==
      (Message)0x0) {
    testing::Message::Message((Message *)&local_f0);
    if (local_b8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_b8.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/component/encapsulation.cpp"
               ,0x177,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      cVar5 = testing::internal::IsTrue(true);
      if ((cVar5 != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_f0._M_dataplus._M_p + 8))();
      }
      local_f0._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_b8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar2 = local_a8;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"invalid","");
  uVar6 = libcellml::ComponentEntity::containsComponent((string *)psVar2,SUB81(&local_f0,0));
  local_b8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (CONCAT71(local_b8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr._1_7_,uVar6) ^ 1);
  local_b8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_b8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ ==
      (Message)0x0) {
    testing::Message::Message((Message *)&local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_f0,(char *)&local_b8,"c->containsComponent(\"invalid\")",
               "true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/component/encapsulation.cpp"
               ,0x178,local_f0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c0,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if (local_d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      cVar5 = testing::internal::IsTrue(true);
      if ((cVar5 != '\0') &&
         (local_d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0)) {
        (**(code **)(*(long *)local_d0.
                              super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 8))();
      }
      local_d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_b8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar2 = local_a8;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"invalid","");
  libcellml::ComponentEntity::component((string *)&local_d0,SUB81(psVar2,0));
  local_c0 = (long *)0x0;
  testing::internal::CmpHelperEQ<std::shared_ptr<libcellml::Component>,decltype(nullptr)>
            ((internal *)&local_b8,"const_c->component(\"invalid\")","nullptr",&local_d0,&local_c0);
  if (local_d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_b8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ ==
      (Message)0x0) {
    testing::Message::Message((Message *)&local_f0);
    if (local_b8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_b8.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/component/encapsulation.cpp"
               ,0x17a,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      cVar5 = testing::internal::IsTrue(true);
      if ((cVar5 != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_f0._M_dataplus._M_p + 8))();
      }
      local_f0._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_b8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar2 = local_a8;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"comp4new","");
  uVar6 = libcellml::ComponentEntity::containsComponent((string *)psVar2,SUB81(&local_f0,0));
  local_b8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (CONCAT71(local_b8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr._1_7_,uVar6) ^ 1);
  local_b8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_b8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ ==
      (Message)0x0) {
    testing::Message::Message((Message *)&local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_f0,(char *)&local_b8,"c->containsComponent(\"comp4new\")",
               "true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/component/encapsulation.cpp"
               ,0x17b,local_f0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c0,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if (local_d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      cVar5 = testing::internal::IsTrue(true);
      if ((cVar5 != '\0') &&
         (local_d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0)) {
        (**(code **)(*(long *)local_d0.
                              super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 8))();
      }
      local_d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_b8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar2 = local_a8;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"comp4new","");
  libcellml::ComponentEntity::component((string *)&local_d0,SUB81(psVar2,0));
  local_c0 = (long *)0x0;
  testing::internal::CmpHelperEQ<std::shared_ptr<libcellml::Component>,decltype(nullptr)>
            ((internal *)&local_b8,"const_c->component(\"comp4new\")","nullptr",&local_d0,&local_c0)
  ;
  if (local_d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_b8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ ==
      (Message)0x0) {
    testing::Message::Message((Message *)&local_f0);
    if (local_b8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_b8.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/component/encapsulation.cpp"
               ,0x17c,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      cVar5 = testing::internal::IsTrue(true);
      if ((cVar5 != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_f0._M_dataplus._M_p + 8))();
      }
      local_f0._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_b8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar2 = local_a8;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"comp4","");
  libcellml::ComponentEntity::replaceComponent
            ((string *)psVar2,(shared_ptr *)&local_f0,SUB81(&local_80,0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  libcellml::ComponentEntity::addComponent
            ((shared_ptr *)
             local_80.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  psVar2 = local_a8;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"comp4new","");
  libcellml::ComponentEntity::component((string *)&local_d0,SUB81(psVar2,0));
  testing::internal::
  CmpHelperEQ<std::shared_ptr<libcellml::Component>,std::shared_ptr<libcellml::Component>>
            ((internal *)&local_b8,"c4n","c->component(\"comp4new\")",&local_80,&local_d0);
  if (local_d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_b8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ ==
      (Message)0x0) {
    testing::Message::Message((Message *)&local_f0);
    if (local_b8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_b8.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/component/encapsulation.cpp"
               ,0x180,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      cVar5 = testing::internal::IsTrue(true);
      if ((cVar5 != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_f0._M_dataplus._M_p + 8))();
      }
      local_f0._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_b8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar2 = local_a8;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"comp6","");
  libcellml::ComponentEntity::takeComponent((string *)&local_b8,SUB81(psVar2,0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  testing::internal::
  CmpHelperEQ<std::shared_ptr<libcellml::Component>,std::shared_ptr<libcellml::Component>>
            ((internal *)&local_f0,"c6","c6take",&local_50,&local_b8);
  if ((char)local_f0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_d0);
    if ((undefined8 *)local_f0._M_string_length == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_f0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/component/encapsulation.cpp"
               ,0x183,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c0,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c0);
    if (local_d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      cVar5 = testing::internal::IsTrue(true);
      if ((cVar5 != '\0') &&
         (local_d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0)) {
        (**(code **)(*(long *)local_d0.
                              super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 8))();
      }
      local_d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_f0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar2 = local_a8;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"comp5","");
  libcellml::ComponentEntity::removeComponent((string *)psVar2,SUB81(&local_f0,0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  libcellml::ComponentEntity::removeComponent(local_a8,SUB81(&local_80,0));
  psVar2 = local_a8;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"comp5","");
  uVar6 = libcellml::ComponentEntity::containsComponent((string *)psVar2,SUB81(&local_f0,0));
  local_d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (CONCAT71(local_d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr._1_7_,uVar6) ^ 1);
  local_d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ ==
      (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_f0,(char *)&local_d0,"c->containsComponent(\"comp5\")",
               "true");
    testing::internal::AssertHelper::AssertHelper
              (local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/component/encapsulation.cpp"
               ,0x187,local_f0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(local_98,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if (local_c0 != (long *)0x0) {
      cVar5 = testing::internal::IsTrue(true);
      if ((cVar5 != '\0') && (local_c0 != (long *)0x0)) {
        (**(code **)(*local_c0 + 8))();
      }
      local_c0 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"comp4new","");
  uVar6 = libcellml::ComponentEntity::containsComponent((string *)local_a8,SUB81(&local_f0,0));
  local_d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (CONCAT71(local_d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr._1_7_,uVar6) ^ 1);
  local_d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ ==
      (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_f0,(char *)&local_d0,"c->containsComponent(\"comp4new\")",
               "true");
    testing::internal::AssertHelper::AssertHelper
              (local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/component/encapsulation.cpp"
               ,0x188,local_f0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(local_98,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if (local_c0 != (long *)0x0) {
      cVar5 = testing::internal::IsTrue(true);
      if ((cVar5 != '\0') && (local_c0 != (long *)0x0)) {
        (**(code **)(*local_c0 + 8))();
      }
      local_c0 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_d0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_b8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_88.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.ptr_);
  }
  if (local_80.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_50.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  if (local_60.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
  }
  return;
}

Assistant:

TEST(Encapsulation, encapsulatedComponentMethods)
{
    libcellml::ComponentPtr c = libcellml::Component::create();
    libcellml::ComponentPtr c1 = libcellml::Component::create();
    libcellml::ComponentPtr c2 = libcellml::Component::create();
    libcellml::ComponentPtr c3 = libcellml::Component::create();
    libcellml::ComponentPtr c4 = libcellml::Component::create();
    libcellml::ComponentPtr c5 = libcellml::Component::create();
    libcellml::ComponentPtr c6 = libcellml::Component::create();
    libcellml::ComponentPtr c4n = libcellml::Component::create();

    c1->setName("comp1");
    c2->setName("comp2");
    c3->setName("comp3");
    c4->setName("comp4");
    c5->setName("comp5");
    c6->setName("comp6");
    c4n->setName("comp4new");

    c->addComponent(c1);
    c1->addComponent(c2);
    c2->addComponent(c3);
    c3->addComponent(c4);
    c4->addComponent(c5);
    c5->addComponent(c6);

    // Contains component
    EXPECT_TRUE(c->containsComponent("comp5"));
    // Get component
    EXPECT_EQ(c4, c->component("comp4"));
    const libcellml::ComponentPtr constC4 = c->component("comp4");
    EXPECT_EQ("comp4", constC4->name());
    EXPECT_FALSE(c->containsComponent("invalid"));
    const libcellml::ComponentPtr &const_c = c;
    EXPECT_EQ(const_c->component("invalid"), nullptr);
    EXPECT_FALSE(c->containsComponent("comp4new"));
    EXPECT_EQ(const_c->component("comp4new"), nullptr);
    // Replace component
    c->replaceComponent("comp4", c4n);
    c4n->addComponent(c5);
    EXPECT_EQ(c4n, c->component("comp4new"));
    // Take component
    libcellml::ComponentPtr c6take = c->takeComponent("comp6");
    EXPECT_EQ(c6, c6take);
    // Remove component
    c->removeComponent("comp5");
    c->removeComponent(c4n);
    EXPECT_FALSE(c->containsComponent("comp5"));
    EXPECT_FALSE(c->containsComponent("comp4new"));
}